

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int normal_scanAtts(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  byte bVar2;
  long lVar3;
  int iVar4;
  XML_Convert_Result XVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar10;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char **ppcVar11;
  unsigned_short *in_R8;
  char **ppcVar12;
  char **ppcVar13;
  bool bVar14;
  char **local_40;
  char *local_38;
  uint uVar9;
  
  uVar6 = (long)end - (long)ptr;
  if ((long)uVar6 < 1) {
    return -1;
  }
  local_38 = end + -2;
  pcVar10 = end;
  local_40 = (char **)ptr;
LAB_003e293f:
  ppcVar12 = local_40;
  uVar9 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*(byte *)local_40);
  uVar8 = uVar9 - 5;
  local_40 = ppcVar12;
  if (0x16 < uVar8) goto switchD_003e2960_caseD_8;
  switch(uVar9) {
  case 5:
    if (uVar6 == 1) {
      return -2;
    }
    XVar5 = (*enc[2].utf16Convert)
                      (enc,local_40,pcVar10,
                       (unsigned_short **)
                       ((long)&switchD_003e2960::switchdataD_00508a84 +
                       (long)(int)(&switchD_003e2960::switchdataD_00508a84)[uVar8]),in_R8);
    local_40 = ppcVar12;
    if (XVar5 == XML_CONVERT_COMPLETED) goto switchD_003e2960_caseD_8;
    local_40 = (char **)((long)ppcVar12 + 2);
    pcVar10 = extraout_RDX_01;
    break;
  case 6:
    if (uVar6 < 3) {
      return -2;
    }
    iVar4 = (**(code **)&enc[2].minBytesPerChar)(enc,local_40);
    local_40 = ppcVar12;
    if (iVar4 == 0) goto switchD_003e2960_caseD_8;
    local_40 = (char **)((long)ppcVar12 + 3);
    pcVar10 = extraout_RDX_00;
    break;
  case 7:
    if (uVar6 < 4) {
      return -2;
    }
    iVar4 = (*enc[3].scanners[0])
                      (enc,(char *)local_40,pcVar10,
                       (char **)((long)&switchD_003e2960::switchdataD_00508a84 +
                                (long)(int)(&switchD_003e2960::switchdataD_00508a84)[uVar8]));
    local_40 = ppcVar12;
    if (iVar4 == 0) goto switchD_003e2960_caseD_8;
    local_40 = (char **)((long)ppcVar12 + 4);
    pcVar10 = extraout_RDX;
    break;
  default:
    goto switchD_003e2960_caseD_8;
  case 9:
  case 10:
  case 0x15:
    ppcVar12 = (char **)((long)local_40 + 1);
    lVar7 = (long)end - (long)ppcVar12;
    while( true ) {
      if (lVar7 < 1) {
        return -1;
      }
      bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar12);
      if ((1 < bVar2 - 9) && (bVar2 != 0x15)) break;
      ppcVar12 = (char **)((long)ppcVar12 + 1);
      lVar7 = lVar7 + -1;
    }
    local_40 = ppcVar12;
    if (bVar2 == 0xe) goto switchD_003e2960_caseD_e;
    goto switchD_003e2960_caseD_8;
  case 0xe:
switchD_003e2960_caseD_e:
    ppcVar13 = (char **)((long)ppcVar12 + 1);
    if ((char **)end == ppcVar13 || (long)end - (long)ppcVar13 < 0) {
      return -1;
    }
    bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar13);
    uVar8 = (uint)bVar2;
    if ((bVar2 & 0xfe) != 0xc) {
      lVar7 = (long)local_38 - (long)ppcVar12;
      do {
        ppcVar12 = ppcVar13;
        ppcVar13 = ppcVar12;
        if ((0x15 < (byte)uVar8) || ((0x200600U >> (uVar8 & 0x1f) & 1) == 0))
        goto switchD_003e2a76_caseD_0;
        if (lVar7 < 1) {
          return -1;
        }
        bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)((long)ppcVar12 + 1));
        uVar8 = (uint)bVar2;
        lVar7 = lVar7 + -1;
        ppcVar13 = (char **)((long)ppcVar12 + 1);
      } while ((bVar2 & 0xfe) != 0xc);
    }
LAB_003e2a30:
    local_40 = (char **)((long)ppcVar12 + 2);
    do {
      while( true ) {
        ppcVar12 = local_40;
        uVar6 = (long)end - (long)local_40;
        if ((long)uVar6 < 1) {
          return -1;
        }
        bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)local_40);
        if (bVar2 == (byte)uVar8) {
          ppcVar13 = (char **)((long)local_40 + 1);
          if ((char **)end == ppcVar13 || (long)end - (long)ppcVar13 < 0) {
            return -1;
          }
          bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar13);
          uVar8 = (uint)bVar2;
          if (bVar2 < 0xb) {
            if (1 < uVar8 - 9) goto switchD_003e2a76_caseD_0;
          }
          else if (bVar2 != 0x15) {
            if (uVar8 == 0xb) goto LAB_003e2d32;
            local_40 = ppcVar13;
            if (uVar8 == 0x11) goto LAB_003e2d01;
            goto switchD_003e2960_caseD_8;
          }
          ppcVar11 = (char **)((long)local_40 + 2);
          if ((char **)end == ppcVar11 || (long)end - (long)ppcVar11 < 0) {
            return -1;
          }
          pcVar10 = (char *)0x2;
          lVar7 = 0;
          goto LAB_003e2bf6;
        }
        uVar9 = (uint)bVar2;
        if (uVar9 < 9) break;
switchD_003e2a76_caseD_4:
        local_40 = (char **)((long)local_40 + 1);
      }
      ppcVar13 = ppcVar12;
      switch(uVar9) {
      default:
        goto switchD_003e2a76_caseD_0;
      case 3:
        iVar4 = normal_scanRef(enc,(char *)((long)local_40 + 1),end,(char **)&local_40);
        if (iVar4 < 1) {
          if (iVar4 != 0) {
            return iVar4;
          }
          goto switchD_003e2960_caseD_8;
        }
        break;
      case 4:
        goto switchD_003e2a76_caseD_4;
      case 5:
        goto switchD_003e2a76_caseD_5;
      case 6:
        if (uVar6 < 3) {
          return -2;
        }
        iVar4 = (*enc[3].sameName)(enc,(char *)local_40,
                                   (char *)&switchD_003e2a76::switchdataD_00508ae0);
        if (iVar4 != 0) goto switchD_003e2a76_caseD_0;
        local_40 = (char **)((long)ppcVar12 + 3);
        break;
      case 7:
        if (uVar6 < 4) {
          return -2;
        }
        iVar4 = (*enc[3].nameMatchesAscii)
                          (enc,(char *)local_40,(char *)&switchD_003e2a76::switchdataD_00508ae0,
                           (char *)((long)&switchD_003e2a76::switchdataD_00508ae0 +
                                   (long)(int)(&switchD_003e2a76::switchdataD_00508ae0)[uVar9]));
        if (iVar4 != 0) goto switchD_003e2a76_caseD_0;
        local_40 = (char **)((long)ppcVar12 + 4);
      }
    } while( true );
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
    local_40 = (char **)((long)local_40 + 1);
  }
  goto LAB_003e296a;
LAB_003e2bf6:
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*(byte *)((long)local_40 + (long)pcVar10)))
  {
  case 5:
    goto switchD_003e2c1e_caseD_5;
  case 6:
    lVar3 = lVar7 - (long)local_40;
    if (end + lVar3 + -2 < (char **)0x3) {
      return -2;
    }
    pbVar1 = (byte *)((long)local_40 + (2 - lVar7));
    local_40 = ppcVar13;
    iVar4 = (*enc[3].scanners[2])(enc,(char *)pbVar1,pcVar10,(char **)(end + lVar3 + -2));
    ppcVar13 = ppcVar11;
    if (iVar4 == 0) goto switchD_003e2a76_caseD_0;
    local_40 = (char **)((long)ppcVar12 + (5 - lVar7));
    pcVar10 = extraout_RDX_04;
    goto LAB_003e296a;
  case 7:
    lVar3 = lVar7 - (long)local_40;
    if (end + lVar3 + -2 < (char **)0x4) {
      return -2;
    }
    ppcVar11 = (char **)((long)local_40 + (2 - lVar7));
    local_40 = ppcVar13;
    iVar4 = (*enc[3].literalScanners[0])(enc,(char *)ppcVar11,pcVar10,(char **)(end + lVar3 + -2));
    ppcVar13 = ppcVar11;
    if (iVar4 == 0) goto switchD_003e2a76_caseD_0;
    local_40 = (char **)((long)ppcVar12 + (6 - lVar7));
    pcVar10 = extraout_RDX_02;
    goto LAB_003e296a;
  default:
    ppcVar13 = (char **)((long)local_40 + (2 - lVar7));
    goto switchD_003e2a76_caseD_0;
  case 9:
  case 10:
  case 0x15:
    goto switchD_003e2c1e_caseD_9;
  case 0xb:
    ppcVar13 = (char **)((long)local_40 + (2 - lVar7));
LAB_003e2d32:
    local_40 = (char **)((long)ppcVar13 + 1);
    iVar4 = 1;
    break;
  case 0x11:
    ppcVar13 = (char **)((long)local_40 + (2 - lVar7));
LAB_003e2d01:
    local_40 = (char **)((long)ppcVar13 + 1);
    if ((char **)end == local_40 || (long)end - (long)local_40 < 0) {
      return -1;
    }
    bVar14 = *(byte *)((long)ppcVar13 + 1) == 0x3e;
    if (bVar14) {
      local_40 = (char **)((long)ppcVar13 + 2);
    }
    iVar4 = (uint)bVar14 * 3;
    break;
  case 0x16:
  case 0x18:
    local_40 = (char **)((long)local_40 + (3 - lVar7));
    goto LAB_003e296a;
  }
  goto LAB_003e2d50;
switchD_003e2c1e_caseD_9:
  ppcVar11 = (char **)((long)ppcVar11 + 1);
  lVar3 = lVar7 - (long)local_40;
  lVar7 = lVar7 + -1;
  pcVar10 = pcVar10 + 1;
  if (end + lVar3 == (char *)0x3 || (long)(end + lVar3 + -3) < 0) {
    return -1;
  }
  goto LAB_003e2bf6;
switchD_003e2a76_caseD_5:
  if (uVar6 == 1) {
    return -2;
  }
  iVar4 = (*enc[3].literalScanners[1])
                    (enc,(char *)local_40,(char *)&switchD_003e2a76::switchdataD_00508ae0,
                     (char **)((long)&switchD_003e2a76::switchdataD_00508ae0 +
                              (long)(int)(&switchD_003e2a76::switchdataD_00508ae0)[uVar9]));
  if (iVar4 != 0) goto switchD_003e2a76_caseD_0;
  goto LAB_003e2a30;
switchD_003e2c1e_caseD_5:
  lVar3 = lVar7 - (long)local_40;
  if ((char **)(end + lVar3) == (char **)0x3) {
    return -2;
  }
  pbVar1 = (byte *)((long)local_40 + (2 - lVar7));
  local_40 = ppcVar13;
  iVar4 = (*enc[3].scanners[1])(enc,(char *)pbVar1,pcVar10,(char **)(end + lVar3));
  ppcVar13 = ppcVar11;
  if (iVar4 != 0) {
    local_40 = (char **)((long)ppcVar12 + (4 - lVar7));
    pcVar10 = extraout_RDX_03;
LAB_003e296a:
    uVar6 = (long)end - (long)local_40;
    if ((long)uVar6 < 1) {
      return -1;
    }
    goto LAB_003e293f;
  }
switchD_003e2a76_caseD_0:
  local_40 = ppcVar13;
switchD_003e2960_caseD_8:
  iVar4 = 0;
LAB_003e2d50:
  *nextTokPtr = (char *)local_40;
  return iVar4;
}

Assistant:

static int PTRCALL
PREFIX(scanAtts)(const ENCODING *enc, const char *ptr, const char *end,
                 const char **nextTokPtr)
{
#ifdef XML_NS
  int hadColon = 0;
#endif
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
#ifdef XML_NS
    case BT_COLON:
      if (hadColon) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      hadColon = 1;
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
      default:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      break;
#endif
    case BT_S: case BT_CR: case BT_LF:
      for (;;) {
        int t;

        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        t = BYTE_TYPE(enc, ptr);
        if (t == BT_EQUALS)
          break;
        switch (t) {
        case BT_S:
        case BT_LF:
        case BT_CR:
          break;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
      }
    /* fall through */
    case BT_EQUALS:
      {
        int open;
#ifdef XML_NS
        hadColon = 0;
#endif
        for (;;) {
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          open = BYTE_TYPE(enc, ptr);
          if (open == BT_QUOT || open == BT_APOS)
            break;
          switch (open) {
          case BT_S:
          case BT_LF:
          case BT_CR:
            break;
          default:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
        }
        ptr += MINBPC(enc);
        /* in attribute value */
        for (;;) {
          int t;
          REQUIRE_CHAR(enc, ptr, end);
          t = BYTE_TYPE(enc, ptr);
          if (t == open)
            break;
          switch (t) {
          INVALID_CASES(ptr, nextTokPtr)
          case BT_AMP:
            {
              int tok = PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, &ptr);
              if (tok <= 0) {
                if (tok == XML_TOK_INVALID)
                  *nextTokPtr = ptr;
                return tok;
              }
              break;
            }
          case BT_LT:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          default:
            ptr += MINBPC(enc);
            break;
          }
        }
        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        switch (BYTE_TYPE(enc, ptr)) {
        case BT_S:
        case BT_CR:
        case BT_LF:
          break;
        case BT_SOL:
          goto sol;
        case BT_GT:
          goto gt;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
        /* ptr points to closing quote */
        for (;;) {
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          switch (BYTE_TYPE(enc, ptr)) {
          CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
          case BT_S: case BT_CR: case BT_LF:
            continue;
          case BT_GT:
          gt:
            *nextTokPtr = ptr + MINBPC(enc);
            return XML_TOK_START_TAG_WITH_ATTS;
          case BT_SOL:
          sol:
            ptr += MINBPC(enc);
            REQUIRE_CHAR(enc, ptr, end);
            if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
              *nextTokPtr = ptr;
              return XML_TOK_INVALID;
            }
            *nextTokPtr = ptr + MINBPC(enc);
            return XML_TOK_EMPTY_ELEMENT_WITH_ATTS;
          default:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          break;
        }
        break;
      }
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}